

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getSINT
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_1U> *this,uint32_t numChannels,uint32_t targetBits)

{
  Color CVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int32_t outValue_1;
  int8_t outValue;
  uint uVar6;
  allocator_type local_29;
  
  if (1 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x3f8,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getSINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  uVar3 = targetBits - 8 >> 3;
  uVar6 = targetBits << 0x1d | uVar3;
  if ((uVar6 < 8) && ((0x8bU >> (uVar3 & 0x1f) & 1) != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((targetBits >> 3) * numChannels * (this->super_Image).height *
                      (this->super_Image).width),&local_29);
    if ((this->super_Image).height != 0) {
      uVar3 = 0;
      do {
        if ((this->super_Image).width != 0) {
          uVar4 = 0;
          do {
            if ((numChannels == 1) && (uVar6 < 8)) {
              uVar5 = (this->super_Image).width * uVar3 + uVar4;
              CVar1.field_0 =
                   (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
                   this->pixels[uVar5].field_0.comps[0];
              puVar2 = (__return_storage_ptr__->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = uVar5 * (targetBits >> 3);
              switch(uVar6) {
              case 0:
                ((anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 *)(puVar2 + uVar5))->comps
                [0] = (uchar)CVar1.field_0;
                break;
              case 1:
                *(ushort *)(puVar2 + uVar5) = (ushort)(byte)CVar1.field_0;
                break;
              case 3:
                *(uint *)(puVar2 + uVar5) = (uint)(byte)CVar1.field_0;
                break;
              case 7:
                *(ulong *)(puVar2 + uVar5) = (ulong)(byte)CVar1.field_0;
              }
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < (this->super_Image).width);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (this->super_Image).height);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x3f9,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getSINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSINT(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : c != 3 ? 0 : componentType{1};
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<int8_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<int16_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<int32_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 8) {
                        const auto outValue = static_cast<int64_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }